

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O3

void PrintEscapedName(ExpressionTranslateContext *ctx,InplaceStr name)

{
  byte bVar1;
  OutputContext *pOVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = (long)name.end - (long)name.begin;
  if ((int)uVar4 != 0) {
    uVar5 = 0;
    do {
      bVar1 = name.begin[uVar5];
      uVar3 = bVar1 - 0x20;
      if ((uVar3 < 0x3e) && ((0x2800000054005311U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
        OutputContext::Print(ctx->output,"_",1);
      }
      else {
        pOVar2 = ctx->output;
        uVar3 = pOVar2->outputBufPos;
        pOVar2->outputBufPos = uVar3 + 1;
        pOVar2->outputBuf[uVar3] = bVar1;
        if (pOVar2->outputBufPos == pOVar2->outputBufSize) {
          (*pOVar2->writeStream)(pOVar2->stream,pOVar2->outputBuf,pOVar2->outputBufPos);
          pOVar2->outputBufPos = 0;
        }
      }
      uVar5 = uVar5 + 1;
    } while ((uVar4 & 0xffffffff) != uVar5);
  }
  return;
}

Assistant:

void PrintEscapedName(ExpressionTranslateContext &ctx, InplaceStr name)
{
	for(unsigned i = 0; i < name.length(); i++)
	{
		char ch = name.begin[i];

		if(ch == ' ' || ch == '[' || ch == ']' || ch == '(' || ch == ')' || ch == ',' || ch == ':' || ch == '$' || ch == '<' || ch == '>' || ch == '.')
			ctx.output.Print("_");
		else
			ctx.output.Print(ch);
	}
}